

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_finite_gt.cpp
# Opt level: O0

void __thiscall
ising_dos_square_finite2_Test::~ising_dos_square_finite2_Test(ising_dos_square_finite2_Test *this)

{
  void *in_RDI;
  
  ~ising_dos_square_finite2_Test((ising_dos_square_finite2_Test *)0x115298);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(ising_dos_square, finite2) {
  auto dos = ising::dos::square::finite<2048, 100>(4, 4);
  EXPECT_EQ(33, dos.size());
  EXPECT_EQ(2, dos[0]);
  EXPECT_EQ(0, dos[2]);
  EXPECT_EQ(32, dos[4]);
  EXPECT_EQ(64, dos[6]);
  EXPECT_EQ(20524, dos[16]);
  EXPECT_EQ(2, dos[32]);
}